

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O2

int saisxx_private::
    computeBWT<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> T,
              __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,
              __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> C,
              __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> B,long n,long k)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  if (C._M_current == B._M_current) {
    getCounts<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (T,C,n,k);
  }
  getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
            (C,B,k,false);
  lVar8 = n + -1;
  uVar6 = T._M_current[n + -1];
  lVar3 = B._M_current[uVar6];
  lVar5 = lVar8;
  if ((1 < n) && (lVar5 = -n, (long)uVar6 <= T._M_current[n + -2])) {
    lVar5 = lVar8;
  }
  SA._M_current[lVar3] = lVar5;
  plVar2 = SA._M_current + lVar3 + 1;
  lVar5 = 0;
  lVar3 = 0;
  if (0 < n) {
    lVar3 = n;
  }
  for (; lVar3 != lVar5; lVar5 = lVar5 + 1) {
    uVar7 = SA._M_current[lVar5];
    if ((long)uVar7 < 1) {
      if (uVar7 != 0) {
        SA._M_current[lVar5] = ~uVar7;
      }
    }
    else {
      uVar1 = T._M_current[uVar7 - 1];
      SA._M_current[lVar5] = ~uVar1;
      if (uVar1 != uVar6) {
        B._M_current[uVar6] = (long)plVar2 - (long)SA._M_current >> 3;
        plVar2 = SA._M_current + B._M_current[uVar1];
        uVar6 = uVar1;
      }
      if (uVar7 == 1) {
        lVar4 = 0;
      }
      else {
        lVar4 = -uVar7;
        if ((long)uVar6 <= T._M_current[uVar7 - 2]) {
          lVar4 = uVar7 - 1;
        }
      }
      *plVar2 = lVar4;
      plVar2 = plVar2 + 1;
    }
  }
  if (C._M_current == B._M_current) {
    getCounts<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (T,C,n,k);
  }
  getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
            (C,B,k,true);
  plVar2 = SA._M_current + *B._M_current;
  lVar5 = 0;
  lVar3 = -1;
  for (; -1 < lVar8; lVar8 = lVar8 + -1) {
    uVar6 = SA._M_current[lVar8];
    if ((long)uVar6 < 1) {
      lVar4 = lVar8;
      if (uVar6 != 0) {
        SA._M_current[lVar8] = ~uVar6;
        lVar4 = lVar3;
      }
    }
    else {
      lVar4 = T._M_current[uVar6 - 1];
      SA._M_current[lVar8] = lVar4;
      if (lVar4 != lVar5) {
        B._M_current[lVar5] = (long)plVar2 - (long)SA._M_current >> 3;
        plVar2 = SA._M_current + B._M_current[lVar4];
        lVar5 = lVar4;
      }
      if (uVar6 == 1) {
        uVar7 = 0;
      }
      else {
        uVar7 = ~T._M_current[uVar6 - 2];
        if (T._M_current[uVar6 - 2] <= lVar5) {
          uVar7 = uVar6 - 1;
        }
      }
      plVar2[-1] = uVar7;
      plVar2 = plVar2 + -1;
      lVar4 = lVar3;
    }
    lVar3 = lVar4;
  }
  return (int)lVar3;
}

Assistant:

int
computeBWT(string_type T, sarray_type SA, bucket_type C, bucket_type B,
           index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j, pidx = -1;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    if(0 < (j = SA[i])) {
      SA[i] = ~(c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    } else if(j != 0) {
      SA[i] = ~j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      SA[i] = (c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((0 < j) && (T[j - 1] > c1)) ? ~((index_type)T[j - 1]) : j;
    } else if(j != 0) {
      SA[i] = ~j;
    } else {
      pidx = i;
    }
  }
  return pidx;
}